

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void insert_suite::insert_array_iterator(void)

{
  type tVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  undefined4 local_5ec;
  iterator local_5e8;
  iterator local_5d0;
  difference_type local_5b8 [2];
  int local_5a8;
  bool local_5a1;
  nullable local_5a0 [2];
  size_type local_598 [2];
  basic_variable<std::allocator<char>_> local_588;
  iterator local_550;
  const_iterator local_538;
  iterator local_520;
  undefined4 local_504;
  iterator local_500;
  iterator local_4e8;
  difference_type local_4d0;
  bool local_4c1;
  nullable local_4c0 [2];
  size_type local_4b8 [2];
  basic_variable<std::allocator<char>_> local_4a8;
  iterator local_470;
  const_iterator local_458;
  iterator local_440;
  undefined4 local_424;
  iterator local_420;
  iterator local_408;
  difference_type local_3f0 [2];
  nullable local_3e0 [2];
  size_type local_3d8;
  nullable local_3cc;
  basic_variable<std::allocator<char>_> local_3c8;
  iterator local_398;
  const_iterator local_380;
  undefined1 local_368 [8];
  iterator where_1;
  size_type local_348 [2];
  undefined1 local_338 [8];
  variable data_1;
  undefined4 local_2fc;
  iterator local_2f8;
  iterator local_2e0;
  difference_type local_2c8 [2];
  nullable local_2b8;
  bool local_2b1;
  int local_2b0 [2];
  size_type local_2a8 [2];
  basic_variable<std::allocator<char>_> local_298;
  iterator local_260;
  const_iterator local_248;
  iterator local_230;
  undefined4 local_214;
  iterator local_210;
  iterator local_1f8;
  difference_type local_1e0;
  nullable local_1d4;
  bool local_1cd;
  undefined4 local_1cc;
  size_type local_1c8 [2];
  basic_variable<std::allocator<char>_> local_1b8;
  iterator local_180;
  const_iterator local_168;
  iterator local_150;
  undefined4 local_134;
  iterator local_130;
  iterator local_118;
  difference_type local_100 [2];
  nullable local_f0 [2];
  size_type local_e8;
  nullable local_dc;
  basic_variable<std::allocator<char>_> local_d8;
  iterator local_a8;
  const_iterator local_90;
  undefined1 local_78 [8];
  iterator where;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_48[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x260,"void insert_suite::insert_array_iterator()",local_48,&local_4c);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_90,&local_a8);
  local_dc = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,&local_dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            ((iterator *)local_78,(basic_variable<std::allocator<char>_> *)local_38,&local_90,
             &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a8);
  local_e8 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_f0[1] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x262,"void insert_suite::insert_array_iterator()",&local_e8,local_f0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_f0[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_f0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x263,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_118,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_130,(iterator *)local_78);
  local_100[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_118,&local_130);
  local_134 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x264,"void insert_suite::insert_array_iterator()",local_100,&local_134);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_180,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_168,&local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1b8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_150,(basic_variable<std::allocator<char>_> *)local_38,&local_168,&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_78,&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_168)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_180);
  local_1c8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_1cc = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x266,"void insert_suite::insert_array_iterator()",local_1c8,&local_1cc);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_1cd = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_1cd);
  boost::detail::test_impl
            ("data[0] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x267,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,1);
  local_1d4 = null;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_1d4);
  boost::detail::test_impl
            ("data[1] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x268,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_210,(iterator *)local_78);
  local_1e0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1f8,&local_210);
  local_214 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x269,"void insert_suite::insert_array_iterator()",&local_1e0,&local_214);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_248,&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_298,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_230,(basic_variable<std::allocator<char>_> *)local_38,&local_248,&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_78,&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_248)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  local_2a8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_2b0[1] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x26b,"void insert_suite::insert_array_iterator()",local_2a8,local_2b0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_2b0[0] = 2;
  tVar1 = trial::dynamic::operator==(pbVar2,local_2b0);
  boost::detail::test_impl
            ("data[0] == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x26c,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,1);
  local_2b1 = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_2b1);
  boost::detail::test_impl
            ("data[1] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x26d,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,2);
  local_2b8 = null;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_2b8);
  boost::detail::test_impl
            ("data[2] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x26e,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2f8,(iterator *)local_78);
  local_2c8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_2e0,&local_2f8);
  local_2fc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x26f,"void insert_suite::insert_array_iterator()",local_2c8,&local_2fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_348[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_338);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x274,"void insert_suite::insert_array_iterator()",local_348,
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_398,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_380,&local_398);
  local_3cc = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,&local_3cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            ((iterator *)local_368,(basic_variable<std::allocator<char>_> *)local_338,&local_380,
             &local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_380)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_398);
  local_3d8 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)local_338);
  local_3e0[1] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x276,"void insert_suite::insert_array_iterator()",&local_3d8,local_3e0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,0);
  local_3e0[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_3e0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x277,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_408,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_420,(iterator *)local_368);
  local_3f0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_408,&local_420);
  local_424 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x278,"void insert_suite::insert_array_iterator()",local_3f0,&local_424);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_470,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_458,&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_440,(basic_variable<std::allocator<char>_> *)local_338,&local_458,&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_368,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_458)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  local_4b8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_338);
  local_4c0[1] = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x27a,"void insert_suite::insert_array_iterator()",local_4b8,local_4c0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,0);
  local_4c0[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_4c0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x27b,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,1);
  local_4c1 = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_4c1);
  boost::detail::test_impl
            ("data[1] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x27c,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e8,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_500,(iterator *)local_368);
  local_4d0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_4e8,&local_500);
  local_504 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x27d,"void insert_suite::insert_array_iterator()",&local_4d0,&local_504);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_550,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_538,&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_588,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_520,(basic_variable<std::allocator<char>_> *)local_338,&local_538,&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_368,&local_520);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_520);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_538)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_550);
  local_598[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_338);
  local_5a0[1] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x27f,"void insert_suite::insert_array_iterator()",local_598,local_5a0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,0);
  local_5a0[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_5a0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x280,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,1);
  local_5a1 = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_5a1);
  boost::detail::test_impl
            ("data[1] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x281,"void insert_suite::insert_array_iterator()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_338,2);
  local_5a8 = 2;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_5a8);
  boost::detail::test_impl
            ("data[2] == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x282,"void insert_suite::insert_array_iterator()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5d0,(basic_variable<std::allocator<char>_> *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5e8,(iterator *)local_368);
  local_5b8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_5d0,&local_5e8);
  local_5ec = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x283,"void insert_suite::insert_array_iterator()",local_5b8,&local_5ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_338);
  return;
}

Assistant:

void insert_array_iterator()
{
    {
        // Inserts at beginning
        variable data = array::make();
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 0);
        auto where = data.insert(data.begin(), null);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
        TRIAL_PROTOCOL_TEST(data[0] == null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
        where = data.insert(data.begin(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
        TRIAL_PROTOCOL_TEST(data[0] == true);
        TRIAL_PROTOCOL_TEST(data[1] == null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
        where = data.insert(data.begin(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 3);
        TRIAL_PROTOCOL_TEST(data[0] == 2);
        TRIAL_PROTOCOL_TEST(data[1] == true);
        TRIAL_PROTOCOL_TEST(data[2] == null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        // Inserts at end
        variable data = array::make();
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 0);
        auto where = data.insert(data.end(), null);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
        TRIAL_PROTOCOL_TEST(data[0] == null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
        where = data.insert(data.end(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
        TRIAL_PROTOCOL_TEST(data[0] == null);
        TRIAL_PROTOCOL_TEST(data[1] == true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        where = data.insert(data.end(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 3);
        TRIAL_PROTOCOL_TEST(data[0] == null);
        TRIAL_PROTOCOL_TEST(data[1] == true);
        TRIAL_PROTOCOL_TEST(data[2] == 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
}